

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zgsrfs.c
# Opt level: O1

void zgsrfs(trans_t trans,SuperMatrix *A,SuperMatrix *L,SuperMatrix *U,int *perm_c,int *perm_r,
           char *equed,double *R,double *C,SuperMatrix *B,SuperMatrix *X,double *ferr,double *berr,
           SuperLUStat_t *stat,int *info)

{
  double *est;
  double dVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  doublecomplex beta;
  int *piVar11;
  int *piVar12;
  doublecomplex *pdVar13;
  int iVar14;
  doublecomplex *zy;
  void *pvVar15;
  doublecomplex *x;
  long lVar16;
  ulong uVar17;
  double *pdVar18;
  long lVar19;
  trans_t tVar20;
  long lVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  int local_270;
  byte local_269;
  trans_t local_268;
  char local_262;
  char transc [1];
  int ione;
  ulong local_228;
  int nrow;
  double local_218;
  trans_t local_20c;
  uint local_208;
  int kase;
  double *local_200;
  int *local_1f8;
  double local_1f0;
  ulong local_1e8;
  void *local_1e0;
  double local_1d8;
  int *local_1d0;
  int *local_1c8;
  SuperMatrix *local_1c0;
  SuperMatrix *local_1b8;
  long local_1b0;
  double local_1a8;
  long local_1a0;
  doublecomplex *local_198;
  double local_190;
  SuperMatrix Bjcol;
  doublecomplex done;
  int isave [3];
  
  ione = 1;
  nrow = A->nrow;
  done.r = 1.0;
  done.i = 0.0;
  pvVar7 = A->Store;
  local_1b0 = *(long *)((long)pvVar7 + 8);
  lVar8 = *(long *)((long)B->Store + 8);
  lVar9 = *(long *)((long)X->Store + 8);
  iVar3 = *B->Store;
  iVar4 = *X->Store;
  local_1a0 = (long)iVar4;
  uVar5 = B->ncol;
  local_228 = (ulong)uVar5;
  *info = 0;
  local_269 = trans != NOTRANS;
  iVar14 = -1;
  if (trans < (CONJ|TRANS)) {
    iVar6 = A->nrow;
    iVar14 = -2;
    if ((((iVar6 < 0) || (iVar6 != A->ncol)) || (A->Stype != SLU_NC)) ||
       ((A->Dtype != SLU_Z || (A->Mtype != SLU_GE)))) goto LAB_0010488c;
    iVar14 = -3;
    if (((L->nrow < 0) || ((L->nrow != L->ncol || (L->Stype != SLU_SC)))) ||
       ((L->Dtype != SLU_Z || (L->Mtype != SLU_TRLU)))) goto LAB_0010488c;
    iVar14 = -4;
    if ((((U->nrow < 0) || (U->nrow != U->ncol)) || (U->Stype != SLU_NC)) ||
       ((U->Dtype != SLU_Z || (U->Mtype != SLU_TRU)))) goto LAB_0010488c;
    iVar14 = -10;
    if (((iVar3 < iVar6) || ((B->Stype != SLU_DN || (B->Dtype != SLU_Z)))) ||
       (iVar14 = -10, B->Mtype != SLU_GE)) goto LAB_0010488c;
    iVar14 = -0xb;
    if ((((iVar4 < iVar6) || (X->Stype != SLU_DN)) || (X->Dtype != SLU_Z)) ||
       (iVar14 = -0xb, X->Mtype != SLU_GE)) goto LAB_0010488c;
  }
  else {
LAB_0010488c:
    *info = iVar14;
  }
  local_268 = trans;
  local_1d0 = perm_c;
  local_1c8 = perm_r;
  if (*info != 0) {
    local_270 = -*info;
    input_error("zgsrfs",&local_270);
    return;
  }
  if (uVar5 == 0 || (long)A->nrow == 0) {
    if ((int)uVar5 < 1) {
      return;
    }
    uVar17 = 0;
    do {
      ferr[uVar17] = 0.0;
      berr[uVar17] = 0.0;
      uVar17 = uVar17 + 1;
    } while (local_228 != uVar17);
    return;
  }
  bVar2 = *equed;
  local_1c0 = L;
  local_1b8 = U;
  zy = doublecomplexMalloc((long)A->nrow * 2);
  pvVar15 = superlu_malloc((long)A->nrow << 3);
  local_1f8 = int32Malloc(A->nrow);
  if ((pvVar15 == (void *)0x0 || zy == (doublecomplex *)0x0) || local_1f8 == (int *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","Malloc fails for work/rwork/iwork.",0xe3,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c");
    trans = local_268;
    superlu_abort_and_exit((char *)isave);
  }
  if (trans == NOTRANS) {
    transc[0] = 'N';
    local_20c = TRANS;
  }
  else {
    if (trans == CONJ) {
      transc[0] = 'C';
    }
    else {
      if (trans != TRANS) goto LAB_001049d5;
      transc[0] = 'T';
    }
    local_20c = NOTRANS;
  }
LAB_001049d5:
  iVar4 = A->ncol;
  local_1d8 = dmach("Epsilon");
  local_1f0 = dmach("Safe minimum");
  tVar20 = local_268;
  local_270 = 0;
  if (0 < A->nrow) {
    do {
      local_1f8[local_270] = 0;
      local_270 = local_270 + 1;
    } while (local_270 < A->nrow);
  }
  if (local_268 == NOTRANS) {
    if (0 < A->ncol) {
      lVar19 = *(long *)((long)pvVar7 + 0x18);
      lVar16 = 0;
      do {
        local_270 = *(int *)(lVar19 + lVar16 * 4);
        lVar21 = lVar16 + 1;
        if (local_270 < *(int *)(lVar19 + 4 + lVar16 * 4)) {
          lVar16 = *(long *)((long)pvVar7 + 0x10);
          do {
            local_1f8[*(int *)(lVar16 + (long)local_270 * 4)] =
                 local_1f8[*(int *)(lVar16 + (long)local_270 * 4)] + 1;
            local_270 = local_270 + 1;
          } while (local_270 < *(int *)(lVar19 + lVar21 * 4));
        }
        lVar16 = lVar21;
      } while (lVar21 < A->ncol);
    }
  }
  else if (0 < A->ncol) {
    lVar16 = *(long *)((long)pvVar7 + 0x18);
    lVar19 = 0;
    do {
      local_1f8[lVar19] = *(int *)(lVar16 + 4 + lVar19 * 4) - *(int *)(lVar16 + lVar19 * 4);
      lVar19 = lVar19 + 1;
    } while (lVar19 < A->ncol);
  }
  Bjcol.Stype = B->Stype;
  Bjcol.Dtype = B->Dtype;
  Bjcol.Mtype = B->Mtype;
  Bjcol.nrow = B->nrow;
  Bjcol.ncol = 1;
  Bjcol.Store = superlu_malloc(0x10);
  if (Bjcol.Store == (void *)0x0) {
    sprintf((char *)isave,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for Bjcol.Store",0x10c,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/zgsrfs.c");
    tVar20 = local_268;
    superlu_abort_and_exit((char *)isave);
  }
  *(int *)Bjcol.Store = iVar3;
  *(doublecomplex **)((long)Bjcol.Store + 8) = zy;
  if ((int)local_228 < 1) {
LAB_0010578e:
    superlu_free(zy);
    superlu_free(pvVar15);
    superlu_free(local_1f8);
    superlu_free(Bjcol.Store);
    return;
  }
  local_1f0 = local_1f0 * (double)(iVar4 + 1);
  local_1a8 = local_1f0 / local_1d8;
  local_262 = tVar20 == NOTRANS && (bVar2 & 0xfe) == 0x42;
  local_269 = local_269 & (bVar2 & 0xef) == 0x42;
  local_200 = &zy->i;
  uVar17 = 0;
  local_1e0 = pvVar15;
LAB_00104bf5:
  local_198 = (doublecomplex *)(uVar17 * (long)iVar3 * 0x10 + lVar8);
  x = (doublecomplex *)(uVar17 * local_1a0 * 0x10 + lVar9);
  local_190 = 3.0;
  local_208 = 0;
  local_1e8 = uVar17;
  do {
    pdVar13 = local_198;
    zcopy_(&nrow,local_198,&ione,zy,&ione);
    beta.i = done.i;
    beta.r = done.r;
    sp_zgemv(transc,(doublecomplex)ZEXT816(0xbff0000000000000),A,x,ione,beta,zy,ione);
    local_270 = 0;
    if (0 < A->nrow) {
      do {
        dVar10 = z_abs1(pdVar13 + local_270);
        *(double *)((long)pvVar15 + (long)local_270 * 8) = dVar10;
        local_270 = local_270 + 1;
      } while (local_270 < A->nrow);
    }
    if (local_268 == NOTRANS) {
      if (0 < A->ncol) {
        lVar19 = 0;
        do {
          dVar10 = z_abs1(x + lVar19);
          lVar16 = local_1b0;
          local_270 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar19 * 4);
          lVar21 = lVar19 + 1;
          if (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar19 * 4)) {
            do {
              dVar1 = z_abs1((doublecomplex *)((long)local_270 * 0x10 + lVar16));
              lVar19 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_270 * 4);
              *(double *)((long)pvVar15 + lVar19 * 8) =
                   dVar1 * dVar10 + *(double *)((long)pvVar15 + lVar19 * 8);
              local_270 = local_270 + 1;
            } while (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar21 * 4));
          }
          lVar19 = lVar21;
        } while (lVar21 < A->ncol);
      }
    }
    else if (0 < A->ncol) {
      lVar19 = 0;
      do {
        lVar21 = local_1b0;
        local_270 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar19 * 4);
        lVar16 = lVar19 + 1;
        dVar10 = 0.0;
        dVar1 = 0.0;
        if (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar19 * 4)) {
          do {
            iVar4 = *(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_270 * 4);
            local_218 = z_abs1((doublecomplex *)((long)local_270 * 0x10 + lVar21));
            dVar10 = z_abs1(x + iVar4);
            dVar10 = dVar1 + dVar10 * local_218;
            local_270 = local_270 + 1;
            dVar1 = dVar10;
          } while (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar16 * 4));
        }
        *(double *)((long)local_1e0 + lVar19 * 8) =
             dVar10 + *(double *)((long)local_1e0 + lVar19 * 8);
        pvVar15 = local_1e0;
        lVar19 = lVar16;
      } while (lVar16 < A->ncol);
    }
    piVar12 = local_1c8;
    piVar11 = local_1d0;
    local_270 = 0;
    if (A->nrow < 1) {
      dVar10 = 0.0;
      uVar22 = SUB84(local_1d8,0);
      uVar23 = (undefined4)((ulong)local_1d8 >> 0x20);
    }
    else {
      dVar10 = 0.0;
      do {
        lVar19 = (long)local_270;
        dVar1 = *(double *)((long)pvVar15 + lVar19 * 8);
        if (dVar1 <= local_1a8) {
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            dVar1 = z_abs1(zy + lVar19);
            if (dVar10 <= (dVar1 + local_1f0) / *(double *)((long)pvVar15 + (long)local_270 * 8)) {
              dVar10 = z_abs1(zy + local_270);
              dVar10 = dVar10 + local_1f0;
              goto LAB_00104f25;
            }
          }
        }
        else {
          dVar1 = z_abs1(zy + lVar19);
          if (dVar10 <= dVar1 / *(double *)((long)pvVar15 + (long)local_270 * 8)) {
            dVar10 = z_abs1(zy + local_270);
LAB_00104f25:
            dVar10 = dVar10 / *(double *)((long)pvVar15 + (long)local_270 * 8);
          }
        }
        local_270 = local_270 + 1;
        uVar22 = SUB84(local_1d8,0);
        uVar23 = (undefined4)((ulong)local_1d8 >> 0x20);
      } while (local_270 < A->nrow);
    }
    pdVar13 = local_198;
    lVar19 = local_1b0;
    berr[local_1e8] = dVar10;
    if (((dVar10 < (double)CONCAT44(uVar23,uVar22) || dVar10 == (double)CONCAT44(uVar23,uVar22)) ||
        (local_190 < dVar10 + dVar10)) || (4 < local_208)) break;
    zgstrs(local_268,local_1c0,local_1b8,piVar11,piVar12,&Bjcol,stat,info);
    zaxpy_(&nrow,&done,zy,&ione,x,&ione);
    local_190 = berr[local_1e8];
    local_208 = local_208 + 1;
  } while( true );
  stat->RefineSteps = local_208;
  local_270 = 0;
  if (0 < A->nrow) {
    do {
      dVar10 = z_abs1(pdVar13 + local_270);
      *(double *)((long)pvVar15 + (long)local_270 * 8) = dVar10;
      local_270 = local_270 + 1;
    } while (local_270 < A->nrow);
  }
  if (local_268 == NOTRANS) {
    if (0 < A->ncol) {
      lVar16 = 0;
      do {
        dVar10 = z_abs1(x + lVar16);
        pvVar15 = local_1e0;
        local_270 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar16 * 4);
        lVar21 = lVar16 + 1;
        if (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar16 * 4)) {
          do {
            dVar1 = z_abs1((doublecomplex *)((long)local_270 * 0x10 + lVar19));
            lVar16 = (long)*(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_270 * 4);
            *(double *)((long)pvVar15 + lVar16 * 8) =
                 dVar1 * dVar10 + *(double *)((long)pvVar15 + lVar16 * 8);
            local_270 = local_270 + 1;
          } while (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar21 * 4));
        }
        lVar16 = lVar21;
      } while (lVar21 < A->ncol);
    }
  }
  else if (0 < A->ncol) {
    lVar16 = 0;
    do {
      local_270 = *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar16 * 4);
      lVar21 = lVar16 + 1;
      dVar10 = 0.0;
      dVar1 = 0.0;
      if (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + 4 + lVar16 * 4)) {
        do {
          local_218 = z_abs1(x + *(int *)(*(long *)((long)pvVar7 + 0x10) + (long)local_270 * 4));
          dVar10 = z_abs1((doublecomplex *)((long)local_270 * 0x10 + lVar19));
          dVar10 = dVar1 + dVar10 * local_218;
          local_270 = local_270 + 1;
          dVar1 = dVar10;
        } while (local_270 < *(int *)(*(long *)((long)pvVar7 + 0x18) + lVar21 * 4));
      }
      *(double *)((long)local_1e0 + lVar16 * 8) = dVar10 + *(double *)((long)local_1e0 + lVar16 * 8)
      ;
      lVar16 = lVar21;
    } while (lVar21 < A->ncol);
  }
  pvVar15 = local_1e0;
  piVar11 = local_1f8;
  local_270 = 0;
  uVar22 = SUB84(local_1a8,0);
  uVar23 = (undefined4)((ulong)local_1a8 >> 0x20);
  if (0 < A->nrow) {
    do {
      uVar17 = -(ulong)((double)CONCAT44(uVar23,uVar22) <
                       *(double *)((long)pvVar15 + (long)local_270 * 8));
      dVar10 = z_abs(zy + local_270);
      lVar19 = (long)local_270;
      dVar10 = (double)(piVar11[lVar19] + 1) * local_1d8 * *(double *)((long)pvVar15 + lVar19 * 8) +
               dVar10;
      uVar22 = SUB84(local_1a8,0);
      uVar23 = (undefined4)((ulong)local_1a8 >> 0x20);
      *(ulong *)((long)pvVar15 + lVar19 * 8) =
           ~uVar17 & (ulong)(local_1f0 + dVar10) | (ulong)dVar10 & uVar17;
      local_270 = local_270 + 1;
    } while (local_270 < A->nrow);
  }
  piVar12 = local_1c8;
  piVar11 = local_1d0;
  kase = 0;
  est = ferr + local_1e8;
  do {
    zlacon2_(&nrow,zy + A->nrow,zy,est,&kase,isave);
    if (kase == 1) {
      if (local_262 == '\0') {
        if (local_269 != 0) {
          iVar4 = A->nrow;
          if ((long)iVar4 < 1) goto LAB_00105515;
          lVar19 = 0;
          pdVar18 = local_200;
          do {
            dVar10 = *pdVar18;
            ((doublecomplex *)(pdVar18 + -1))->r = ((doublecomplex *)(pdVar18 + -1))->r * R[lVar19];
            *pdVar18 = dVar10 * R[lVar19];
            lVar19 = lVar19 + 1;
            pdVar18 = pdVar18 + 2;
          } while (iVar4 != lVar19);
          goto LAB_00105517;
        }
      }
      else {
        iVar4 = A->ncol;
        if ((long)iVar4 < 1) {
LAB_00105515:
          lVar19 = 0;
        }
        else {
          lVar19 = 0;
          pdVar18 = local_200;
          do {
            dVar10 = *pdVar18;
            ((doublecomplex *)(pdVar18 + -1))->r = ((doublecomplex *)(pdVar18 + -1))->r * C[lVar19];
            *pdVar18 = dVar10 * C[lVar19];
            lVar19 = lVar19 + 1;
            pdVar18 = pdVar18 + 2;
          } while (iVar4 != lVar19);
        }
LAB_00105517:
        local_270 = (int)lVar19;
      }
      zgstrs(local_20c,local_1c0,local_1b8,piVar11,piVar12,&Bjcol,stat,info);
      iVar4 = A->nrow;
      if ((long)iVar4 < 1) goto LAB_00105597;
      lVar19 = 0;
      pdVar18 = local_200;
      do {
        dVar10 = *pdVar18;
        ((doublecomplex *)(pdVar18 + -1))->r =
             ((doublecomplex *)(pdVar18 + -1))->r * *(double *)((long)pvVar15 + lVar19 * 8);
        *pdVar18 = dVar10 * *(double *)((long)pvVar15 + lVar19 * 8);
        lVar19 = lVar19 + 1;
        pdVar18 = pdVar18 + 2;
      } while (iVar4 != lVar19);
LAB_00105599:
      local_270 = (int)lVar19;
    }
    else {
      if (kase == 0) break;
      iVar4 = A->nrow;
      if ((long)iVar4 < 1) {
        lVar19 = 0;
      }
      else {
        lVar19 = 0;
        pdVar18 = local_200;
        do {
          dVar10 = *pdVar18;
          ((doublecomplex *)(pdVar18 + -1))->r =
               ((doublecomplex *)(pdVar18 + -1))->r * *(double *)((long)pvVar15 + lVar19 * 8);
          *pdVar18 = dVar10 * *(double *)((long)pvVar15 + lVar19 * 8);
          lVar19 = lVar19 + 1;
          pdVar18 = pdVar18 + 2;
        } while (iVar4 != lVar19);
      }
      local_270 = (int)lVar19;
      zgstrs(local_268,local_1c0,local_1b8,piVar11,piVar12,&Bjcol,stat,info);
      if (local_262 != '\0') {
        iVar4 = A->ncol;
        if (0 < (long)iVar4) {
          lVar19 = 0;
          pdVar18 = local_200;
          do {
            dVar10 = *pdVar18;
            ((doublecomplex *)(pdVar18 + -1))->r = ((doublecomplex *)(pdVar18 + -1))->r * C[lVar19];
            *pdVar18 = dVar10 * C[lVar19];
            lVar19 = lVar19 + 1;
            pdVar18 = pdVar18 + 2;
          } while (iVar4 != lVar19);
          goto LAB_00105599;
        }
LAB_00105597:
        lVar19 = 0;
        goto LAB_00105599;
      }
      if (local_269 != 0) {
        iVar4 = A->ncol;
        if ((long)iVar4 < 1) goto LAB_00105597;
        lVar19 = 0;
        pdVar18 = local_200;
        do {
          dVar10 = *pdVar18;
          ((doublecomplex *)(pdVar18 + -1))->r = ((doublecomplex *)(pdVar18 + -1))->r * R[lVar19];
          *pdVar18 = dVar10 * R[lVar19];
          lVar19 = lVar19 + 1;
          pdVar18 = pdVar18 + 2;
        } while (iVar4 != lVar19);
        goto LAB_00105599;
      }
    }
  } while (kase != 0);
  local_270 = 0;
  iVar4 = A->nrow;
  if (local_262 == '\0') {
    if (local_269 == 0) {
      if (0 < iVar4) {
        uVar22 = 0;
        uVar23 = 0;
        do {
          dVar10 = z_abs1(x + local_270);
          if ((double)CONCAT44(uVar23,uVar22) <= dVar10) {
            dVar10 = z_abs1(x + local_270);
            uVar22 = SUB84(dVar10,0);
            uVar23 = (undefined4)((ulong)dVar10 >> 0x20);
          }
          dVar10 = (double)CONCAT44(uVar23,uVar22);
          local_270 = local_270 + 1;
        } while (local_270 < A->nrow);
        goto LAB_00105759;
      }
    }
    else if (0 < iVar4) {
      dVar10 = 0.0;
      do {
        local_218 = R[local_270];
        dVar1 = z_abs1(x + local_270);
        if (dVar10 <= dVar1 * local_218) {
          dVar1 = R[local_270];
          dVar10 = z_abs1(x + local_270);
          dVar10 = dVar10 * dVar1;
        }
        local_270 = local_270 + 1;
      } while (local_270 < A->nrow);
      goto LAB_00105759;
    }
  }
  else if (0 < iVar4) {
    dVar10 = 0.0;
    do {
      local_218 = C[local_270];
      dVar1 = z_abs1(x + local_270);
      if (dVar10 <= dVar1 * local_218) {
        dVar1 = C[local_270];
        dVar10 = z_abs1(x + local_270);
        dVar10 = dVar10 * dVar1;
      }
      local_270 = local_270 + 1;
    } while (local_270 < A->nrow);
    goto LAB_00105759;
  }
  dVar10 = 0.0;
LAB_00105759:
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    *est = *est / dVar10;
  }
  uVar17 = local_1e8 + 1;
  if (uVar17 == local_228) goto LAB_0010578e;
  goto LAB_00104bf5;
}

Assistant:

void
zgsrfs(trans_t trans, SuperMatrix *A, SuperMatrix *L, SuperMatrix *U,
       int *perm_c, int *perm_r, char *equed, double *R, double *C,
       SuperMatrix *B, SuperMatrix *X, double *ferr, double *berr,
       SuperLUStat_t *stat, int *info)
{


#define ITMAX 5
    
    /* Table of constant values */
    int    ione = 1, nrow = A->nrow;
    doublecomplex ndone = {-1., 0.};
    doublecomplex done = {1., 0.};
    
    /* Local variables */
    NCformat *Astore;
    doublecomplex   *Aval;
    SuperMatrix Bjcol;
    DNformat *Bstore, *Xstore, *Bjcol_store;
    doublecomplex   *Bmat, *Xmat, *Bptr, *Xptr;
    int      kase;
    double   safe1, safe2;
    int      i, j, k, irow, nz, count, notran, rowequ, colequ;
    int      ldb, ldx, nrhs;
    double   s, xk, lstres, eps, safmin;
    char     transc[1];
    trans_t  transt;
    doublecomplex   *work;
    double   *rwork;
    int      *iwork;
    int      isave[3];

    extern int zlacon2_(int *, doublecomplex *, doublecomplex *, double *, int *, int []);

    Astore = A->Store;
    Aval   = Astore->nzval;
    Bstore = B->Store;
    Xstore = X->Store;
    Bmat   = Bstore->nzval;
    Xmat   = Xstore->nzval;
    ldb    = Bstore->lda;
    ldx    = Xstore->lda;
    nrhs   = B->ncol;
    
    /* Test the input parameters */
    *info = 0;
    notran = (trans == NOTRANS);
    if ( !notran && trans != TRANS && trans != CONJ ) *info = -1;
    else if ( A->nrow != A->ncol || A->nrow < 0 ||
	      A->Stype != SLU_NC || A->Dtype != SLU_Z || A->Mtype != SLU_GE )
	*info = -2;
    else if ( L->nrow != L->ncol || L->nrow < 0 ||
 	      L->Stype != SLU_SC || L->Dtype != SLU_Z || L->Mtype != SLU_TRLU )
	*info = -3;
    else if ( U->nrow != U->ncol || U->nrow < 0 ||
 	      U->Stype != SLU_NC || U->Dtype != SLU_Z || U->Mtype != SLU_TRU )
	*info = -4;
    else if ( ldb < SUPERLU_MAX(0, A->nrow) ||
 	      B->Stype != SLU_DN || B->Dtype != SLU_Z || B->Mtype != SLU_GE )
        *info = -10;
    else if ( ldx < SUPERLU_MAX(0, A->nrow) ||
 	      X->Stype != SLU_DN || X->Dtype != SLU_Z || X->Mtype != SLU_GE )
	*info = -11;
    if (*info != 0) {
	i = -(*info);
	input_error("zgsrfs", &i);
	return;
    }

    /* Quick return if possible */
    if ( A->nrow == 0 || nrhs == 0) {
	for (j = 0; j < nrhs; ++j) {
	    ferr[j] = 0.;
	    berr[j] = 0.;
	}
	return;
    }

    rowequ = strncmp(equed, "R", 1)==0 || strncmp(equed, "B", 1)==0;
    colequ = strncmp(equed, "C", 1)==0 || strncmp(equed, "B", 1)==0;
    
    /* Allocate working space */
    work = doublecomplexMalloc(2*A->nrow);
    rwork = (double *) SUPERLU_MALLOC( A->nrow * sizeof(double) );
    iwork = int32Malloc(A->nrow);
    if ( !work || !rwork || !iwork ) 
        ABORT("Malloc fails for work/rwork/iwork.");
    
    if ( notran ) {
	*(unsigned char *)transc = 'N';
        transt = TRANS;
    } else if ( trans == TRANS ) {
	*(unsigned char *)transc = 'T';
	transt = NOTRANS;
    } else if ( trans == CONJ ) {
	*(unsigned char *)transc = 'C';
	transt = NOTRANS;
    }    

    /* NZ = maximum number of nonzero elements in each row of A, plus 1 */
    nz     = A->ncol + 1;
    eps    = dmach("Epsilon");
    safmin = dmach("Safe minimum");

    /* Set SAFE1 essentially to be the underflow threshold times the
       number of additions in each row. */
    safe1  = nz * safmin;
    safe2  = safe1 / eps;

    /* Compute the number of nonzeros in each row (or column) of A */
    for (i = 0; i < A->nrow; ++i) iwork[i] = 0;
    if ( notran ) {
	for (k = 0; k < A->ncol; ++k)
	    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) 
		++iwork[Astore->rowind[i]];
    } else {
	for (k = 0; k < A->ncol; ++k)
	    iwork[k] = Astore->colptr[k+1] - Astore->colptr[k];
    }	

    /* Copy one column of RHS B into Bjcol. */
    Bjcol.Stype = B->Stype;
    Bjcol.Dtype = B->Dtype;
    Bjcol.Mtype = B->Mtype;
    Bjcol.nrow  = B->nrow;
    Bjcol.ncol  = 1;
    Bjcol.Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !Bjcol.Store ) ABORT("SUPERLU_MALLOC fails for Bjcol.Store");
    Bjcol_store = Bjcol.Store;
    Bjcol_store->lda = ldb;
    Bjcol_store->nzval = work; /* address aliasing */
	
    /* Do for each right hand side ... */
    for (j = 0; j < nrhs; ++j) {
	count = 0;
	lstres = 3.;
	Bptr = &Bmat[j*ldb];
	Xptr = &Xmat[j*ldx];

	while (1) { /* Loop until stopping criterion is satisfied. */

	    /* Compute residual R = B - op(A) * X,   
	       where op(A) = A, A**T, or A**H, depending on TRANS. */
	    
#ifdef _CRAY
	    CCOPY(&nrow, Bptr, &ione, work, &ione);
#else
	    zcopy_(&nrow, Bptr, &ione, work, &ione);
#endif
	    sp_zgemv(transc, ndone, A, Xptr, ione, done, work, ione);

	    /* Compute componentwise relative backward error from formula 
	       max(i) ( abs(R(i)) / ( abs(op(A))*abs(X) + abs(B) )(i) )   
	       where abs(Z) is the componentwise absolute value of the matrix
	       or vector Z.  If the i-th component of the denominator is less
	       than SAFE2, then SAFE1 is added to the i-th component of the   
	       numerator before dividing. */

	    for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	    
	    /* Compute abs(op(A))*abs(X) + abs(B). */
	    if ( notran ) {
		for (k = 0; k < A->ncol; ++k) {
		    xk = z_abs1( &Xptr[k] );
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
			rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
		}
	    } else {  /* trans = TRANS or CONJ */
		for (k = 0; k < A->ncol; ++k) {
		    s = 0.;
		    for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
			irow = Astore->rowind[i];
			s += z_abs1(&Aval[i]) * z_abs1(&Xptr[irow]);
		    }
		    rwork[k] += s;
		}
	    }
	    s = 0.;
	    for (i = 0; i < A->nrow; ++i) {
		if (rwork[i] > safe2) {
		    s = SUPERLU_MAX( s, z_abs1(&work[i]) / rwork[i] );
                } else if ( rwork[i] != 0.0 ) {
		    s = SUPERLU_MAX( s, (z_abs1(&work[i]) + safe1) / rwork[i] );
                }
                /* If rwork[i] is exactly 0.0, then we know the true 
                   residual also must be exactly 0.0. */
	    }
	    berr[j] = s;

	    /* Test stopping criterion. Continue iterating if   
	       1) The residual BERR(J) is larger than machine epsilon, and   
	       2) BERR(J) decreased by at least a factor of 2 during the   
	          last iteration, and   
	       3) At most ITMAX iterations tried. */

	    if (berr[j] > eps && berr[j] * 2. <= lstres && count < ITMAX) {
		/* Update solution and try again. */
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
#ifdef _CRAY
		CAXPY(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#else
		zaxpy_(&nrow, &done, work, &ione,
		       &Xmat[j*ldx], &ione);
#endif
		lstres = berr[j];
		++count;
	    } else {
		break;
	    }
        
	} /* end while */

	stat->RefineSteps = count;

	/* Bound error from formula:
	   norm(X - XTRUE) / norm(X) .le. FERR = norm( abs(inv(op(A)))*   
	   ( abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) / norm(X)   
          where   
            norm(Z) is the magnitude of the largest component of Z   
            inv(op(A)) is the inverse of op(A)   
            abs(Z) is the componentwise absolute value of the matrix or
	       vector Z   
            NZ is the maximum number of nonzeros in any row of A, plus 1   
            EPS is machine epsilon   

          The i-th component of abs(R)+NZ*EPS*(abs(op(A))*abs(X)+abs(B))   
          is incremented by SAFE1 if the i-th component of   
          abs(op(A))*abs(X) + abs(B) is less than SAFE2.   

          Use ZLACON2 to estimate the infinity-norm of the matrix   
             inv(op(A)) * diag(W),   
          where W = abs(R) + NZ*EPS*( abs(op(A))*abs(X)+abs(B) ))) */
	
	for (i = 0; i < A->nrow; ++i) rwork[i] = z_abs1( &Bptr[i] );
	
	/* Compute abs(op(A))*abs(X) + abs(B). */
	if ( notran ) {
	    for (k = 0; k < A->ncol; ++k) {
		xk = z_abs1( &Xptr[k] );
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i)
		    rwork[Astore->rowind[i]] += z_abs1(&Aval[i]) * xk;
	    }
	} else {  /* trans == TRANS or CONJ */
	    for (k = 0; k < A->ncol; ++k) {
		s = 0.;
		for (i = Astore->colptr[k]; i < Astore->colptr[k+1]; ++i) {
		    irow = Astore->rowind[i];
		    xk = z_abs1( &Xptr[irow] );
		    s += z_abs1(&Aval[i]) * xk;
		}
		rwork[k] += s;
	    }
	}
	
	for (i = 0; i < A->nrow; ++i)
	    if (rwork[i] > safe2)
		rwork[i] = z_abs(&work[i]) + (iwork[i]+1)*eps*rwork[i];
	    else
		rwork[i] = z_abs(&work[i])+(iwork[i]+1)*eps*rwork[i]+safe1;
	kase = 0;

	do {
	    zlacon2_(&nrow, &work[A->nrow], work, &ferr[j], &kase, isave);
	    if (kase == 0) break;

	    if (kase == 1) {
		/* Multiply by diag(W)*inv(op(A)**T)*(diag(C) or diag(R)). */
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
	            }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->nrow; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);
                    }

		zgstrs (transt, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
	 	}
	    } else {
		/* Multiply by (diag(C) or diag(R))*inv(op(A))*diag(W). */
		for (i = 0; i < A->nrow; ++i) {
		    zd_mult(&work[i], &work[i], rwork[i]);
		}
		
		zgstrs (trans, L, U, perm_c, perm_r, &Bjcol, stat, info);
		
		if ( notran && colequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], C[i]);
		    }
		else if ( !notran && rowequ )
		    for (i = 0; i < A->ncol; ++i) {
		        zd_mult(&work[i], &work[i], R[i]);  
		    }
	    }
	    
	} while ( kase != 0 );

	/* Normalize error. */
	lstres = 0.;
 	if ( notran && colequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, C[i] * z_abs1( &Xptr[i]) );
  	} else if ( !notran && rowequ ) {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, R[i] * z_abs1( &Xptr[i]) );
	} else {
	    for (i = 0; i < A->nrow; ++i)
	    	lstres = SUPERLU_MAX( lstres, z_abs1( &Xptr[i]) );
	}
	if ( lstres != 0. )
	    ferr[j] /= lstres;

    } /* for each RHS j ... */
    
    SUPERLU_FREE(work);
    SUPERLU_FREE(rwork);
    SUPERLU_FREE(iwork);
    SUPERLU_FREE(Bjcol.Store);

    return;

}